

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_light.cpp
# Opt level: O3

Light_EvalRes *
embree::PointLight_eval
          (Light_EvalRes *__return_storage_ptr__,Light *super,DifferentialGeometry *dg,Vec3fa *dir)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  *(undefined8 *)&(__return_storage_ptr__->value).field_0 = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->value).field_0 + 8) = 0;
  __return_storage_ptr__->dist = INFINITY;
  __return_storage_ptr__->pdf = 0.0;
  fVar11 = (float)super[0xc].type;
  if (0.0 < fVar11) {
    fVar3 = (float)super[4].type - (dg->P).field_0.m128[0];
    fVar8 = (float)super[5].type - (dg->P).field_0.m128[1];
    fVar9 = (float)super[6].type - (dg->P).field_0.m128[2];
    fVar10 = (float)super[7].type - (dg->P).field_0.m128[3];
    fVar12 = (dir->field_0).m128[0];
    fVar16 = (dir->field_0).m128[1];
    fVar13 = (dir->field_0).m128[2];
    fVar15 = fVar13 * fVar13 + fVar16 * fVar16 + fVar12 * fVar12;
    fVar13 = fVar13 * fVar9;
    fVar14 = (dir->field_0).m128[3] * fVar10;
    fVar12 = fVar13 + fVar16 * fVar8 + fVar12 * fVar3;
    fVar12 = fVar12 + fVar12;
    fVar8 = fVar8 * fVar8;
    fVar9 = fVar9 * fVar9;
    fVar10 = fVar10 * fVar10;
    fVar16 = fVar8 + fVar3 * fVar3 + fVar9;
    fVar3 = fVar8 + fVar8 + fVar10;
    fVar9 = fVar8 + fVar9 + fVar9;
    fVar10 = fVar8 + fVar10 + fVar10;
    fVar11 = fVar15 * -4.0 * (fVar16 - fVar11 * fVar11) + fVar12 * fVar12;
    if (0.0 < fVar11) {
      fVar4 = SQRT(fVar11);
      fVar8 = fVar4;
      if (fVar11 < 0.0) {
        fVar8 = sqrtf(fVar11);
      }
      if (fVar11 < 0.0) {
        fVar4 = sqrtf(fVar11);
      }
      if (0.0 < (fVar4 + fVar12) / (fVar15 + fVar15)) {
        fVar12 = (fVar12 - fVar8) / (fVar15 + fVar15);
        __return_storage_ptr__->dist = fVar12;
        auVar5._4_4_ = fVar3;
        auVar5._0_4_ = fVar16;
        auVar5._8_4_ = fVar9;
        auVar5._12_4_ = fVar10;
        auVar6._4_4_ = fVar3;
        auVar6._0_4_ = fVar16;
        auVar6._8_4_ = fVar9;
        auVar6._12_4_ = fVar10;
        auVar6 = rcpss(auVar5,auVar6);
        fVar11 = 1.0 - (2.0 - fVar16 * auVar6._0_4_) * auVar6._0_4_ *
                       (float)super[0xc].type * (float)super[0xc].type;
        if (fVar11 < 0.0) {
          fVar11 = sqrtf(fVar11);
        }
        else {
          fVar11 = SQRT(fVar11);
        }
        auVar7._0_4_ = (SUB124(ZEXT812(0x3f800000),0) - fVar11) * 6.2831855;
        auVar7._4_8_ = SUB128(ZEXT812(0x3f800000),4);
        auVar7._12_4_ = 0;
        auVar6 = rcpss(ZEXT416((uint)auVar7._0_4_),auVar7);
        fVar3 = (2.0 - auVar7._0_4_ * auVar6._0_4_) * auVar6._0_4_;
        __return_storage_ptr__->pdf = fVar3;
        auVar2._4_4_ = fVar14;
        auVar2._0_4_ = fVar12;
        auVar2._8_4_ = fVar13;
        auVar2._12_4_ = fVar14;
        auVar1._4_4_ = fVar14;
        auVar1._0_4_ = fVar12;
        auVar1._8_4_ = fVar13;
        auVar1._12_4_ = fVar14;
        auVar6 = rcpss(auVar2,auVar1);
        fVar13 = (2.0 - fVar12 * auVar6._0_4_) * auVar6._0_4_;
        fVar11 = (float)super[9].type;
        fVar12 = (float)super[10].type;
        fVar16 = (float)super[0xb].type;
        fVar13 = fVar13 * fVar13;
        (__return_storage_ptr__->value).field_0.m128[0] = fVar13 * fVar3 * (float)super[8].type;
        (__return_storage_ptr__->value).field_0.m128[1] = fVar13 * fVar3 * fVar11;
        (__return_storage_ptr__->value).field_0.m128[2] = fVar13 * fVar3 * fVar12;
        (__return_storage_ptr__->value).field_0.m128[3] = fVar13 * fVar3 * fVar16;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes PointLight_eval(const Light* super,
                                                           const DifferentialGeometry& dg,
                                                           const Vec3fa& dir)
{
  const PointLight* self = (PointLight*)super;
  Light_EvalRes res;
  res.value = Vec3fa(0.f);
  res.dist = inf;
  res.pdf = 0.f;

  if (self->radius > 0.f) {
    const Vec3fa A = self->position - dg.P;
    const float a = dot(dir, dir);
    const float b = 2.f * dot(dir, A);
    const float centerDist2 = dot(A, A);
    const float c = centerDist2 - sqr(self->radius);
    const float radical = sqr(b) - 4.f*a*c;

    if (radical > 0.f) {
      const float t_near = (b - sqrt(radical)) / (2.f*a);
      const float t_far = (b + sqrt(radical)) / (2.f*a);

      if (t_far > 0.0f) {
        // TODO: handle interior case
        res.dist = t_near;
        const float sinTheta2 = sqr(self->radius) * rcp(centerDist2);
        const float cosTheta = sqrt(1.f - sinTheta2);
        res.pdf = uniformSampleConePDF(cosTheta);
        const float invdist = rcp(t_near);
        res.value = self->power * res.pdf * sqr(invdist);
      }
    }
  }

  return res;
}